

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcd.c
# Opt level: O2

void trn_bcd(mdl_t *mdl)

{
  int *piVar1;
  size_t sVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint32_t len;
  seq_t *psVar6;
  long lVar7;
  double *pdVar8;
  char *pcVar9;
  double *pdVar10;
  double *pdVar11;
  opt_t *poVar12;
  long lVar13;
  long lVar14;
  mdl_t *pmVar15;
  _Bool _Var16;
  uint32_t s;
  undefined4 uVar17;
  int iVar18;
  ulong uVar19;
  void *pvVar20;
  bcd_t *pbVar21;
  double *pdVar22;
  uint32_t *puVar23;
  grd_st_t *pgVar24;
  uint uVar25;
  uint64_t o_1;
  ulong uVar26;
  uint64_t o;
  uint64_t uVar27;
  mdl_t *pmVar28;
  uint32_t t;
  ulong uVar29;
  int iVar30;
  uint32_t b;
  ulong uVar31;
  ulong uVar32;
  double dVar33;
  double *pdVar34;
  uint32_t n;
  uint32_t y_1;
  uint32_t yp;
  double *pdVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  size_t sStack_e0;
  double local_d8;
  ulong local_d0;
  double *local_c8;
  long local_c0;
  ulong local_b8;
  double *local_b0;
  double *local_a8;
  ulong local_a0;
  double local_98;
  undefined8 uStack_90;
  uint32_t local_7c;
  void *local_78;
  double local_70;
  double *local_68;
  uint local_5c;
  void *local_58;
  seq_t *local_50;
  mdl_t *local_48;
  bcd_t *local_40;
  uint64_t local_38;
  
  local_a0 = (ulong)mdl->nlbl;
  uVar27 = mdl->nobs;
  uVar4 = mdl->train->mlen;
  uVar26 = (ulong)mdl->train->nseq;
  local_7c = mdl->opt->maxiter;
  sStack_e0 = 0x105a77;
  local_48 = mdl;
  info("    - Build the index\n");
  sStack_e0 = 0x105a85;
  info("        1/2 -- scan the sequences\n");
  local_38 = uVar27;
  uVar19 = uVar27 * 4 + 0xf & 0xfffffffffffffff0;
  lVar13 = -0xd8 - uVar19;
  lVar14 = lVar13 - uVar19;
  for (uVar27 = 0; pmVar28 = local_48, local_38 != uVar27; uVar27 = uVar27 + 1) {
    *(undefined4 *)((long)&local_d8 + uVar27 * 4 + lVar13 + 0xd8) = 0;
    *(undefined4 *)((long)&local_d8 + uVar27 * 4 + lVar14 + 0xd8) = 0xffffffff;
  }
  for (uVar19 = 0; uVar27 = local_38, uVar19 != uVar26; uVar19 = uVar19 + 1) {
    psVar6 = pmVar28->train->seq[uVar19];
    uVar25 = psVar6->len;
    for (uVar29 = 0; uVar29 != uVar25; uVar29 = uVar29 + 1) {
      uVar5 = *(uint *)&psVar6[uVar29 * 2 + 1].field_0x4;
      for (uVar31 = 0; uVar5 != uVar31; uVar31 = uVar31 + 1) {
        *(int *)((long)&local_d8 +
                *(long *)(*(long *)(psVar6 + uVar29 * 2 + 2) + uVar31 * 8) * 4 + lVar14 + 0xd8) =
             (int)uVar19;
      }
      uVar5 = *(uint *)&psVar6[uVar29 * 2 + 1].raw;
      for (uVar31 = 0; uVar5 != uVar31; uVar31 = uVar31 + 1) {
        *(int *)((long)&local_d8 + psVar6[uVar29 * 2 + 2].raw[uVar31] * 4 + lVar14 + 0xd8) =
             (int)uVar19;
      }
    }
    for (uVar27 = 0; local_38 != uVar27; uVar27 = uVar27 + 1) {
      piVar1 = (int *)((long)&local_d8 + uVar27 * 4 + lVar13 + 0xd8);
      *piVar1 = *piVar1 + (uint)(uVar19 == *(uint *)((long)&local_d8 + uVar27 * 4 + lVar14 + 0xd8));
    }
  }
  sVar2 = local_38 * 4;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105b6a;
  local_78 = xmalloc(sVar2);
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105b7b;
  local_58 = xmalloc(uVar27 * 8);
  for (uVar27 = 0; local_38 != uVar27; uVar27 = uVar27 + 1) {
    uVar25 = *(uint *)((long)&local_d8 + uVar27 * 4 + lVar13 + 0xd8);
    *(uint *)((long)local_78 + uVar27 * 4) = uVar25;
    *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105b9b;
    pvVar20 = xmalloc((ulong)uVar25 << 2);
    *(void **)((long)local_58 + uVar27 * 8) = pvVar20;
  }
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105bb8;
  info("        2/2 -- Populate the index\n");
  for (uVar27 = 0; pmVar28 = local_48, local_38 != uVar27; uVar27 = uVar27 + 1) {
    *(undefined4 *)((long)&local_d8 + uVar27 * 4 + lVar13 + 0xd8) = 0;
    *(undefined4 *)((long)&local_d8 + uVar27 * 4 + lVar14 + 0xd8) = 0xffffffff;
  }
  for (uVar19 = 0; uVar19 != uVar26; uVar19 = uVar19 + 1) {
    psVar6 = pmVar28->train->seq[uVar19];
    uVar25 = psVar6->len;
    for (uVar29 = 0; uVar17 = (undefined4)uVar19, uVar29 != uVar25; uVar29 = uVar29 + 1) {
      uVar5 = *(uint *)&psVar6[uVar29 * 2 + 1].field_0x4;
      for (uVar31 = 0; uVar5 != uVar31; uVar31 = uVar31 + 1) {
        *(undefined4 *)
         ((long)&local_d8 +
         *(long *)(*(long *)(psVar6 + uVar29 * 2 + 2) + uVar31 * 8) * 4 + lVar14 + 0xd8) = uVar17;
      }
      uVar5 = *(uint *)&psVar6[uVar29 * 2 + 1].raw;
      for (uVar31 = 0; uVar5 != uVar31; uVar31 = uVar31 + 1) {
        *(undefined4 *)((long)&local_d8 + psVar6[uVar29 * 2 + 2].raw[uVar31] * 4 + lVar14 + 0xd8) =
             uVar17;
      }
    }
    for (uVar27 = 0; local_38 != uVar27; uVar27 = uVar27 + 1) {
      if (uVar19 == *(uint *)((long)&local_d8 + uVar27 * 4 + lVar14 + 0xd8)) {
        lVar7 = *(long *)((long)local_58 + uVar27 * 8);
        uVar25 = *(uint *)((long)&local_d8 + uVar27 * 4 + lVar13 + 0xd8);
        *(uint *)((long)&local_d8 + uVar27 * 4 + lVar13 + 0xd8) = uVar25 + 1;
        *(undefined4 *)(lVar7 + (ulong)uVar25 * 4) = uVar17;
      }
    }
  }
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105c86;
  info("      Done\n");
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x38;
  sVar2 = *(size_t *)((long)&sStack_e0 + lVar14 + 0xd8);
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105c8e;
  pbVar21 = (bcd_t *)xmalloc(sVar2);
  uVar26 = local_a0;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105ca0;
  pdVar22 = xvm_new(uVar26);
  pbVar21->ugrd = pdVar22;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105cac;
  pdVar22 = xvm_new(uVar26);
  pbVar21->uhes = pdVar22;
  uVar19 = (ulong)(uint)((int)uVar26 * (int)uVar26);
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105cbf;
  pdVar22 = xvm_new(uVar19);
  pbVar21->bgrd = pdVar22;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105ccb;
  pdVar22 = xvm_new(uVar19);
  pbVar21->bhes = pdVar22;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105cdb;
  puVar23 = (uint32_t *)xmalloc((ulong)uVar4 << 2);
  pbVar21->actpos = puVar23;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105ce9;
  pgVar24 = grd_stnew(pmVar28,(double *)0x0);
  local_40 = pbVar21;
  pbVar21->grd_st = pgVar24;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 1;
  uVar19 = *(ulong *)((long)&sStack_e0 + lVar14 + 0xd8);
  do {
    if (local_7c < (uint)uVar19) break;
    local_5c = (uint)uVar19;
    for (dVar38 = 0.0; dVar38 != (double)local_38; dVar38 = (double)((long)dVar38 + 1)) {
      iVar18 = 0;
      for (uVar27 = 0; uVar27 != uVar26; uVar27 = uVar27 + 1) {
        local_40->ugrd[uVar27] = 0.0;
        local_40->uhes[uVar27] = 0.0;
        pdVar22 = local_40->bgrd;
        pdVar35 = local_40->bhes;
        for (iVar30 = 0; (int)uVar26 != iVar30; iVar30 = iVar30 + 1) {
          pdVar22[(uint)(iVar18 + iVar30)] = 0.0;
          pdVar35[(uint)(iVar18 + iVar30)] = 0.0;
        }
        iVar18 = iVar18 + (int)uVar26;
      }
      *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 1;
      uVar19 = *(ulong *)((long)&sStack_e0 + lVar14 + 0xd8);
      uVar26 = 0;
      local_98 = dVar38;
      while (pbVar21 = local_40, uVar26 < *(uint *)((long)local_78 + (long)dVar38 * 4)) {
        psVar6 = pmVar28->train->seq
                 [*(uint *)(*(long *)((long)local_58 + (long)dVar38 * 8) + uVar26 * 4)];
        uVar4 = psVar6->len;
        puVar23 = local_40->actpos;
        local_50 = psVar6 + 1;
        uVar25 = 0;
        for (uVar29 = 0; uVar29 != uVar4; uVar29 = uVar29 + 1) {
          if ((pmVar28->kind[(long)dVar38] & 1U) == 0) {
            uVar31 = 0;
          }
          else {
            uVar31 = 0;
            for (uVar32 = 0;
                ((uVar31 & 1) == 0 && (uVar32 < *(uint *)&local_50[uVar29 * 2].field_0x4));
                uVar32 = uVar32 + 1) {
              uVar31 = uVar31 & 0xff;
              if ((double)*(uint64_t *)(*(long *)(local_50 + uVar29 * 2 + 1) + uVar32 * 8) == dVar38
                 ) {
                uVar31 = uVar19 & 0xffffffff;
              }
            }
          }
          if ((pmVar28->kind[(long)dVar38] & 2U) != 0) {
            for (uVar32 = 0; ((uVar31 & 1) == 0 && (uVar32 < *(uint *)&local_50[uVar29 * 2].raw));
                uVar32 = uVar32 + 1) {
              uVar31 = uVar31 & 0xff;
              if ((double)local_50[uVar29 * 2 + 1].raw[uVar32] == dVar38) {
                uVar31 = uVar19 & 0xffffffff;
              }
            }
          }
          if ((uVar31 & 1) != 0) {
            uVar31 = (ulong)uVar25;
            uVar25 = uVar25 + 1;
            puVar23[uVar31] = (uint32_t)uVar29;
          }
        }
        local_40->actcnt = uVar25;
        pgVar24 = local_40->grd_st;
        pgVar24->first = *puVar23;
        pgVar24->last = puVar23[uVar25 - 1];
        len = psVar6->len;
        local_b8 = uVar26;
        *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105e6c;
        grd_stcheck(pgVar24,len);
        pgVar24 = pbVar21->grd_st;
        if (pmVar28->opt->sparse == true) {
          *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105e81;
          grd_spdopsi(pgVar24,psVar6);
          pgVar24 = pbVar21->grd_st;
          *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105e8d;
          grd_spfwdbwd(pgVar24,psVar6);
          *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105e9e;
          bcd_spgradhes(pmVar28,pbVar21,psVar6,(uint64_t)dVar38);
          *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 1;
          uVar19 = *(ulong *)((long)&sStack_e0 + lVar14 + 0xd8);
        }
        else {
          *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105ebf;
          grd_fldopsi(pgVar24,psVar6);
          pgVar24 = pbVar21->grd_st;
          *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x105ecb;
          grd_flfwdbwd(pgVar24,psVar6);
          pgVar24 = pbVar21->grd_st;
          uVar4 = pmVar28->nlbl;
          uVar26 = (ulong)uVar4;
          local_c8 = pgVar24->psi;
          local_b0 = pgVar24->alpha;
          local_a8 = pgVar24->beta;
          pdVar22 = pgVar24->bnorm;
          local_68 = (double *)pbVar21->actpos;
          local_70 = (double)(ulong)pbVar21->actcnt;
          pdVar35 = pbVar21->bgrd;
          pdVar8 = pbVar21->bhes;
          pcVar9 = pmVar28->kind;
          bVar3 = pcVar9[(long)dVar38];
          *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 1;
          uVar19 = *(ulong *)((long)&sStack_e0 + lVar14 + 0xd8);
          if ((bVar3 & 1) != 0) {
            pdVar34 = pgVar24->unorm;
            pdVar10 = local_40->ugrd;
            pdVar11 = local_40->uhes;
            for (dVar33 = 0.0; pmVar15 = local_48, dVar33 != local_70;
                dVar33 = (double)((long)dVar33 + 1)) {
              uVar19 = (ulong)*(uint *)((long)local_68 + (long)dVar33 * 4);
              for (uVar29 = 0; uVar26 != uVar29; uVar29 = uVar29 + 1) {
                dVar38 = local_b0[uVar19 * uVar26 + uVar29] * local_a8[uVar19 * uVar26 + uVar29] *
                         pdVar34[uVar19];
                pdVar10[uVar29] = pdVar10[uVar29] + dVar38;
                pdVar11[uVar29] = (1.0 - dVar38) * dVar38 + pdVar11[uVar29];
              }
              pdVar10[local_50[uVar19 * 2].len] = pdVar10[local_50[uVar19 * 2].len] + -1.0;
              *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 1;
              uVar19 = *(ulong *)((long)&sStack_e0 + lVar14 + 0xd8);
              pmVar28 = pmVar15;
              dVar38 = local_98;
            }
            bVar3 = pcVar9[(long)dVar38];
          }
          if ((bVar3 & 2) != 0) {
            local_c0 = uVar26 * uVar26;
            for (dVar33 = 0.0; pmVar15 = local_48, dVar33 != local_70;
                dVar33 = (double)((long)dVar33 + 1)) {
              uVar25 = *(uint *)((long)local_68 + (long)dVar33 * 4);
              uVar29 = (ulong)uVar25;
              if (uVar29 != 0) {
                local_d8 = dVar33;
                local_d0 = (ulong)(uVar25 - 1);
                pdVar34 = local_c8 + local_c0 * uVar29;
                uVar25 = 0;
                for (uVar19 = 0; uVar19 != uVar26; uVar19 = uVar19 + 1) {
                  for (uVar31 = 0; uVar26 != uVar31; uVar31 = uVar31 + 1) {
                    dVar38 = local_b0[local_d0 * uVar26 + uVar19] *
                             local_a8[uVar29 * uVar26 + uVar31] * pdVar34[uVar31] * pdVar22[uVar29];
                    uVar32 = uVar31 + uVar25 & 0xffffffff;
                    pdVar35[uVar32] = pdVar35[uVar32] + dVar38;
                    pdVar8[uVar32] = (1.0 - dVar38) * dVar38 + pdVar8[uVar32];
                  }
                  pdVar34 = pdVar34 + uVar26;
                  uVar25 = uVar25 + (int)uVar31;
                  dVar38 = local_98;
                }
                uVar25 = local_50[local_d0 * 2].len * uVar4 + local_50[uVar29 * 2].len;
                pdVar35[uVar25] = pdVar35[uVar25] + -1.0;
                *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 1;
                uVar19 = *(ulong *)((long)&sStack_e0 + lVar14 + 0xd8);
                pmVar28 = pmVar15;
                dVar33 = local_d8;
              }
            }
          }
        }
        uVar26 = local_b8 + 1;
      }
      poVar12 = pmVar28->opt;
      dVar33 = (poVar12->bcd).kappa;
      uVar4 = pmVar28->nlbl;
      uVar19 = (ulong)uVar4;
      pdVar22 = local_40->bhes;
      bVar3 = pmVar28->kind[(long)dVar38];
      local_98 = poVar12->rho1;
      uStack_90 = 0;
      local_50 = (seq_t *)poVar12->rho2;
      pdVar35 = local_40->bgrd;
      if ((bVar3 & 1) != 0) {
        pdVar35 = local_40->ugrd;
        pdVar8 = local_40->uhes;
        dVar36 = 1.0;
        for (uVar26 = 0; uVar19 != uVar26; uVar26 = uVar26 + 1) {
          dVar37 = ABS(pdVar35[uVar26] / pdVar8[uVar26]);
          if (dVar37 <= dVar36) {
            dVar37 = dVar36;
          }
          dVar36 = dVar37;
        }
        local_70 = dVar33;
        local_68 = local_40->bgrd;
        *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x1061ce;
        xvm_scale(pdVar8,pdVar8,dVar36 * dVar33,uVar19);
        uVar27 = local_48->uoff[(long)dVar38];
        pdVar34 = local_48->theta;
        for (uVar26 = 0; uVar19 != uVar26; uVar26 = uVar26 + 1) {
          dVar33 = pdVar34[uVar27 + uVar26] * pdVar8[uVar26] - pdVar35[uVar26];
          if (dVar33 <= local_98) {
            dVar36 = 0.0;
            if (dVar33 < -local_98) {
              dVar36 = dVar33 + local_98;
            }
          }
          else {
            dVar36 = dVar33 - local_98;
          }
          pdVar34[uVar27 + uVar26] = dVar36 / (pdVar8[uVar26] + (double)local_50);
        }
        bVar3 = local_48->kind[(long)dVar38];
        pmVar28 = local_48;
        pdVar35 = local_68;
        dVar33 = local_70;
      }
      if ((bVar3 & 2) != 0) {
        uVar26 = (ulong)(uVar4 * uVar4);
        dVar36 = 1.0;
        for (uVar19 = 0; uVar26 != uVar19; uVar19 = uVar19 + 1) {
          dVar37 = ABS(pdVar35[uVar19] / pdVar22[uVar19]);
          if (ABS(pdVar35[uVar19] / pdVar22[uVar19]) <= dVar36) {
            dVar37 = dVar36;
          }
          dVar36 = dVar37;
        }
        *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x1062cc;
        xvm_scale(pdVar22,pdVar22,dVar33 * dVar36,uVar26);
        uVar27 = pmVar28->boff[(long)dVar38];
        pdVar8 = pmVar28->theta;
        for (uVar19 = 0; uVar26 != uVar19; uVar19 = uVar19 + 1) {
          dVar33 = pdVar8[uVar27 + uVar19] * pdVar22[uVar19] - pdVar35[uVar19];
          if (dVar33 <= local_98) {
            dVar36 = 0.0;
            if (dVar33 < -local_98) {
              dVar36 = dVar33 + local_98;
            }
          }
          else {
            dVar36 = dVar33 - local_98;
          }
          pdVar8[uVar27 + uVar19] = dVar36 / (pdVar22[uVar19] + (double)local_50);
        }
      }
      uVar19 = (ulong)local_5c;
      uVar26 = local_a0;
    }
    *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x10635e;
    _Var16 = uit_progress(pmVar28,(uint32_t)uVar19,-1.0);
    uVar19 = (ulong)(local_5c + 1);
  } while (_Var16);
  pbVar21 = local_40;
  pgVar24 = local_40->grd_st;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x106388;
  grd_stfree(pgVar24);
  pdVar22 = pbVar21->ugrd;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x106390;
  xvm_free(pdVar22);
  pdVar22 = pbVar21->uhes;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x106399;
  xvm_free(pdVar22);
  pdVar22 = pbVar21->bgrd;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x1063a2;
  xvm_free(pdVar22);
  pdVar22 = pbVar21->bhes;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x1063ab;
  xvm_free(pdVar22);
  puVar23 = pbVar21->actpos;
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x1063b4;
  free(puVar23);
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x1063bc;
  free(pbVar21);
  for (uVar27 = 0; pvVar20 = local_58, local_38 != uVar27; uVar27 = uVar27 + 1) {
    pvVar20 = *(void **)((long)local_58 + uVar27 * 8);
    *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x1063d1;
    free(pvVar20);
  }
  *(undefined8 *)((long)&sStack_e0 + lVar14 + 0xd8) = 0x1063df;
  free(pvVar20);
  free(local_78);
  return;
}

Assistant:

void trn_bcd(mdl_t *mdl) {
	const uint32_t Y = mdl->nlbl;
	const uint64_t O = mdl->nobs;
	const uint32_t S = mdl->train->nseq;
	const uint32_t T = mdl->train->mlen;
	const uint32_t K = mdl->opt->maxiter;
	// Build the index:
	//   Count active sequences per blocks
	info("    - Build the index\n");
	info("        1/2 -- scan the sequences\n");
	uint64_t tot = 0;
	uint32_t cnt[O], lcl[O];
	for (uint64_t o = 0; o < O; o++)
		cnt[o] = 0, lcl[o] = (uint32_t)-1;
	for (uint32_t s = 0; s < S; s++) {
		// List actives blocks
		const seq_t *seq = mdl->train->seq[s];
		for (uint32_t t = 0; t < seq->len; t++) {
			for (uint32_t b = 0; b < seq->pos[t].ucnt; b++)
				lcl[seq->pos[t].uobs[b]] = s;
			for (uint32_t b = 0; b < seq->pos[t].bcnt; b++)
				lcl[seq->pos[t].bobs[b]] = s;
		}
		// Updates blocks count
		for (uint64_t o = 0; o < O; o++)
			cnt[o] += (lcl[o] == s);
	}
	for (uint64_t o = 0; o < O; o++)
		tot += cnt[o];
	// Allocate memory
	uint32_t  *idx_cnt = xmalloc(sizeof(uint32_t  ) * O);
	uint32_t **idx_lst = xmalloc(sizeof(uint32_t *) * O);
	for (uint64_t o = 0; o < O; o++) {
		idx_cnt[o] = cnt[o];
		idx_lst[o] = xmalloc(sizeof(uint32_t) * cnt[o]);
	}
	// Populate the index
	info("        2/2 -- Populate the index\n");
	for (uint64_t o = 0; o < O; o++)
		cnt[o] = 0, lcl[o] = (uint32_t)-1;
	for (uint32_t s = 0; s < S; s++) {
		// List actives blocks
		const seq_t *seq = mdl->train->seq[s];
		for (uint32_t t = 0; t < seq->len; t++) {
			for (uint32_t b = 0; b < seq->pos[t].ucnt; b++)
				lcl[seq->pos[t].uobs[b]] = s;
			for (uint32_t b = 0; b < seq->pos[t].bcnt; b++)
				lcl[seq->pos[t].bobs[b]] = s;
		}
		// Build index
		for (uint64_t o = 0; o < O; o++)
			if (lcl[o] == s)
				idx_lst[o][cnt[o]++] = s;
	}
	info("      Done\n");
	// Allocate the specific trainer of BCD
	bcd_t *bcd = xmalloc(sizeof(bcd_t));
	bcd->ugrd   = xvm_new(Y);
	bcd->uhes   = xvm_new(Y);
	bcd->bgrd   = xvm_new(Y * Y);
	bcd->bhes   = xvm_new(Y * Y);
	bcd->actpos = xmalloc(sizeof(int) * T);
	bcd->grd_st = grd_stnew(mdl, NULL);
	// And train the model
	for (uint32_t i = 1; i <= K; i++) {
		for (uint64_t o = 0; o < O; o++) {
			// Clear the gradient and the hessian
			for (uint32_t y = 0, d = 0; y < Y; y++) {
				bcd->ugrd[y] = 0.0;
				bcd->uhes[y] = 0.0;
				for (uint32_t yp = 0; yp < Y; yp++, d++) {
					bcd->bgrd[d] = 0.0;
					bcd->bhes[d] = 0.0;
				}
			}
			// Process active sequences
			for (uint32_t s = 0; s < idx_cnt[o]; s++) {
				const uint32_t id = idx_lst[o][s];
				const seq_t *seq = mdl->train->seq[id];
				bcd_actpos(mdl, bcd, seq, o);
				grd_stcheck(bcd->grd_st, seq->len);
				if (mdl->opt->sparse) {
					grd_spdopsi(bcd->grd_st, seq);
					grd_spfwdbwd(bcd->grd_st, seq);
					bcd_spgradhes(mdl, bcd, seq, o);
				} else {
					grd_fldopsi(bcd->grd_st, seq);
					grd_flfwdbwd(bcd->grd_st, seq);
					bcd_flgradhes(mdl, bcd, seq, o);
				}
			}
			// And update the model
			bcd_update(mdl, bcd, o);
		}
		if (!uit_progress(mdl, i, -1.0))
			break;
	}
	// Cleanup memory
	grd_stfree(bcd->grd_st);
	xvm_free(bcd->ugrd); xvm_free(bcd->uhes);
	xvm_free(bcd->bgrd); xvm_free(bcd->bhes);
	free(bcd->actpos);
	free(bcd);
	for (uint64_t o = 0; o < O; o++)
		free(idx_lst[o]);
	free(idx_lst);
	free(idx_cnt);
}